

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t type,wchar_t tag,wchar_t flags,
                   wchar_t *wname,wchar_t perm,wchar_t id)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  int *piVar6;
  wchar_t *pwVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 local_38;
  
  local_38 = CONCAT44(type,id);
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar7 = *wp;
    sVar2 = wcslen(pwVar7);
    *wp = pwVar7 + sVar2;
  }
  switch(tag) {
  case L'✑':
    pwVar7 = *wp;
    goto LAB_0028a0df;
  case L'✒':
    pwVar7 = *wp;
    if ((type & 0x3c00U) != 0) {
      piVar6 = anon_var_dwarf_1f1676;
      break;
    }
    wname = (wchar_t *)0x0;
    local_38 = CONCAT44(type,0xffffffff);
LAB_0028a0df:
    piVar6 = anon_var_dwarf_3dedc;
LAB_0028a0e6:
    wcscpy(pwVar7,piVar6 + 1);
    goto LAB_0028a0eb;
  case L'✓':
    pwVar7 = *wp;
LAB_0028a0cc:
    piVar6 = anon_var_dwarf_3d9da;
    goto LAB_0028a0e6;
  case L'✔':
    pwVar7 = *wp;
    if ((type & 0x3c00U) == 0) {
      wname = (wchar_t *)0x0;
      local_38 = CONCAT44(type,0xffffffff);
      goto LAB_0028a0cc;
    }
    piVar6 = anon_var_dwarf_1f1681;
    break;
  case L'✕':
    pwVar7 = *wp;
    piVar6 = anon_var_dwarf_1f1799;
    break;
  case L'✖':
    pwVar7 = *wp;
    piVar6 = anon_var_dwarf_1f17a4;
    break;
  default:
    if (tag == L'❻') {
      pwVar7 = *wp;
      piVar6 = anon_var_dwarf_1f168c;
      break;
    }
    goto LAB_0028a0eb;
  }
  wcscpy(pwVar7,piVar6);
  local_38 = CONCAT44(type,0xffffffff);
  wname = (wchar_t *)0x0;
LAB_0028a0eb:
  pwVar7 = *wp;
  sVar2 = wcslen(pwVar7);
  pwVar7 = pwVar7 + sVar2 + 1;
  *wp = pwVar7;
  pwVar7[-1] = L':';
  if (((local_38 & 0x30000000000) != 0) || ((tag | 2U) == 0x2713)) {
    if (wname == (wchar_t *)0x0) {
      if ((tag | 2U) != 0x2713) goto LAB_0028a149;
      append_id_w(wp,(wchar_t)local_38);
      wVar5 = (wchar_t)local_38 | -(uint)((local_38 & 0x3c0000000000) == 0);
      pwVar7 = *wp;
LAB_0028a1a1:
      *pwVar7 = L':';
      pwVar7 = pwVar7 + 1;
    }
    else {
      wcscpy(pwVar7,wname);
      pwVar7 = *wp;
      sVar2 = wcslen(pwVar7);
      pwVar7 = pwVar7 + sVar2;
LAB_0028a149:
      wVar5 = (wchar_t)local_38;
      if ((0xfffffffdU < (uint)(tag + L'\xffffd8e9') & (byte)((uint)(flags & 4U) >> 2)) == 0)
      goto LAB_0028a1a1;
    }
    uVar9 = local_38 & 0x30000000000;
    local_38._0_4_ = wVar5;
    if (uVar9 != 0) {
      uVar9 = CONCAT44(-(uint)((perm & 0x92U) == 0),-(uint)((perm & 0x124U) == 0));
      wVar5 = L'x';
      if ((perm & 0x49U) == 0) {
        wVar5 = L'-';
      }
      *(ulong *)pwVar7 = uVar9 & (ulong)DAT_002db610 | ~uVar9 & (ulong)DAT_002db600;
      pwVar4 = pwVar7 + 3;
      *wp = pwVar4;
      pwVar7[2] = wVar5;
      goto LAB_0028a2e2;
    }
  }
  lVar3 = 8;
  do {
    if ((*(uint *)((long)anon_var_dwarf_1f17c6 + lVar3 + 0x24) & perm) == 0) {
      wVar5 = L'-';
      if ((flags & 0x10U) == 0) goto LAB_0028a235;
    }
    else {
      wVar5 = *(wchar_t *)((long)&nfsv4_acl_perm_map[0].perm + lVar3);
LAB_0028a235:
      *pwVar7 = wVar5;
      pwVar7 = pwVar7 + 1;
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0xb0);
  *pwVar7 = L':';
  pwVar7 = pwVar7 + 1;
  lVar3 = 8;
  do {
    if ((*(uint *)(&UNK_002db978 + lVar3) & perm) == 0) {
      if ((flags & 0x10U) == 0) {
        *wp = pwVar7 + 1;
        wVar5 = L'-';
        goto LAB_0028a27f;
      }
    }
    else {
      wVar5 = *(wchar_t *)((long)&nfsv4_acl_flag_map[0].perm + lVar3);
LAB_0028a27f:
      *pwVar7 = wVar5;
      pwVar7 = pwVar7 + 1;
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x5c);
  *wp = pwVar7 + 1;
  *pwVar7 = L':';
  uVar1 = local_38._4_4_ - 0x400U >> 10;
  uVar8 = local_38._4_4_ << 0x16 | uVar1;
  if ((uVar8 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    wcscpy(pwVar7 + 1,(wchar_t *)(&DAT_002db9d4 + *(int *)(&DAT_002db9d4 + (ulong)uVar8 * 4)));
  }
  pwVar4 = *wp;
  sVar2 = wcslen(pwVar4);
  pwVar4 = pwVar4 + sVar2;
  *wp = pwVar4;
LAB_0028a2e2:
  if ((wchar_t)local_38 == L'\xffffffff') {
    return;
  }
  *wp = pwVar4 + 1;
  *pwVar4 = L':';
  append_id_w(wp,(wchar_t)local_38);
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int type,
    int tag, int flags, const wchar_t *wname, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		wcscpy(*wp, L"everyone@");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (wname != NULL) {
			wcscpy(*wp, wname);
			*wp += wcslen(*wp);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id_w(wp, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*wp)++ = L':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*wp)++ = (perm & 0444) ? L'r' : L'-';
		*(*wp)++ = (perm & 0222) ? L'w' : L'-';
		*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*wp)++ = nfsv4_acl_perm_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*wp)++ = nfsv4_acl_flag_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			wcscpy(*wp, L"allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			wcscpy(*wp, L"deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			wcscpy(*wp, L"audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			wcscpy(*wp, L"alarm");
			break;
		default:
			break;
		}
		*wp += wcslen(*wp);
	}
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
}